

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int renameTableSelectCb(Walker *pWalker,Select *pSelect)

{
  RenameCtx *pCtx;
  int *piVar1;
  long in_RSI;
  undefined8 *in_RDI;
  SrcList_item *pItem;
  SrcList *pSrc;
  RenameCtx *p;
  int i;
  int local_14;
  
  pCtx = (RenameCtx *)in_RDI[5];
  piVar1 = *(int **)(in_RSI + 0x28);
  for (local_14 = 0; local_14 < *piVar1; local_14 = local_14 + 1) {
    if (*(Table **)(piVar1 + (long)local_14 * 0x1c + 10) == pCtx->pTab) {
      renameTokenFind((Parse *)*in_RDI,pCtx,*(void **)(piVar1 + (long)local_14 * 0x1c + 6));
    }
  }
  return 0;
}

Assistant:

static int renameTableSelectCb(Walker *pWalker, Select *pSelect){
  int i;
  RenameCtx *p = pWalker->u.pRename;
  SrcList *pSrc = pSelect->pSrc;
  for(i=0; i<pSrc->nSrc; i++){
    struct SrcList_item *pItem = &pSrc->a[i];
    if( pItem->pTab==p->pTab ){
      renameTokenFind(pWalker->pParse, p, pItem->zName);
    }
  }

  return WRC_Continue;
}